

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.h
# Opt level: O1

void __thiscall
lzham::quasi_adaptive_huffman_data_model::set_malloc_context
          (quasi_adaptive_huffman_data_model *this,lzham_malloc_context malloc_context)

{
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  
  *(lzham_malloc_context *)this = malloc_context;
  if (*(void **)(this + 8) != (void *)0x0) {
    lzham::lzham_free(*(lzham **)(this + 0x18),*(void **)(this + 8),in_RDX);
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    in_RDX = extraout_RDX;
  }
  *(lzham_malloc_context *)(this + 0x18) = malloc_context;
  if (*(void **)(this + 0x20) != (void *)0x0) {
    lzham::lzham_free(*(lzham **)(this + 0x30),*(void **)(this + 0x20),in_RDX);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    in_RDX = extraout_RDX_00;
  }
  *(lzham_malloc_context *)(this + 0x30) = malloc_context;
  if (*(void **)(this + 0x38) != (void *)0x0) {
    lzham::lzham_free(*(lzham **)(this + 0x48),*(void **)(this + 0x38),in_RDX);
    *(undefined8 *)(this + 0x38) = 0;
    *(undefined8 *)(this + 0x40) = 0;
    in_RDX = extraout_RDX_01;
  }
  *(lzham_malloc_context *)(this + 0x48) = malloc_context;
  if (*(void **)(this + 0x50) != (void *)0x0) {
    lzham::lzham_free(*(lzham **)(this + 0x60),*(void **)(this + 0x50),in_RDX);
    *(undefined8 *)(this + 0x50) = 0;
    *(undefined8 *)(this + 0x58) = 0;
  }
  *(lzham_malloc_context *)(this + 0x60) = malloc_context;
  return;
}

Assistant:

void set_malloc_context(lzham_malloc_context malloc_context) 
      { 
         m_malloc_context = malloc_context; 
         m_initial_sym_freq.set_malloc_context(malloc_context);
         m_sym_freq.set_malloc_context(malloc_context);
         m_codes.set_malloc_context(malloc_context);
         m_code_sizes.set_malloc_context(malloc_context);
      }